

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness.cpp
# Opt level: O0

void __thiscall spvtools::opt::analysis::LivenessManager::InitializeAnalysis(LivenessManager *this)

{
  ExecutionModel EVar1;
  IRContext *this_00;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined1 local_44 [28];
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *local_28;
  undefined4 local_14;
  LivenessManager *local_10;
  LivenessManager *this_local;
  
  local_10 = this;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->live_locs_);
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::clear(&this->live_builtins_);
  this_00 = context(this);
  EVar1 = IRContext::GetStage(this_00);
  if (EVar1 == ExecutionModelFragment) {
    local_14 = 1;
    local_28 = std::
               unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
               ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                        &this->live_builtins_,
                        (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)&stack0xffffffffffffffec,(value_type *)CONCAT71(extraout_var,extraout_DL)
                       );
    local_44._24_4_ = 3;
    local_44._4_8_ =
         std::
         unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
         ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
                  &this->live_builtins_,
                  (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)(local_44 + 0x18),(value_type *)CONCAT71(extraout_var_00,extraout_DL_00));
    local_44._0_4_ = 4;
    std::
    unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
    ::insert((pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> *)
             &this->live_builtins_,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)local_44,(value_type *)CONCAT71(extraout_var_01,extraout_DL_01));
  }
  return;
}

Assistant:

void LivenessManager::InitializeAnalysis() {
  live_locs_.clear();
  live_builtins_.clear();
  // Mark all builtins live for frag shader.
  if (context()->GetStage() == spv::ExecutionModel::Fragment) {
    live_builtins_.insert(uint32_t(spv::BuiltIn::PointSize));
    live_builtins_.insert(uint32_t(spv::BuiltIn::ClipDistance));
    live_builtins_.insert(uint32_t(spv::BuiltIn::CullDistance));
  }
}